

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bltrimws(bstring b)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  ushort **ppuVar4;
  ulong uVar5;
  
  iVar3 = -1;
  if (((b != (bstring)0x0) && (puVar2 = b->data, puVar2 != (uchar *)0x0)) && (0 < b->mlen)) {
    uVar1 = b->slen;
    if (((int)uVar1 <= b->mlen) && (-1 < (int)uVar1)) {
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        ppuVar4 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar4 + (ulong)puVar2[uVar5] * 2 + 1) & 0x20) == 0) {
          iVar3 = bdelete(b,0,(int)uVar5);
          return iVar3;
        }
      }
      *puVar2 = '\0';
      b->slen = 0;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int bltrimws (bstring b) {
int i, len;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (len = b->slen, i = 0; i < len; i++) {
		if (!wspace (b->data[i])) {
			return bdelete (b, 0, i);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return BSTR_OK;
}